

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft4g.c
# Opt level: O2

void bitrv2conj(int n,int *ip,double *a)

{
  int iVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  long lVar14;
  int iVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  int iVar19;
  ulong uVar20;
  
  *ip = 0;
  uVar10 = 1;
  while( true ) {
    if (n <= (int)(uVar10 * 8)) break;
    n = n >> 1;
    uVar7 = 0;
    if (0 < (int)uVar10) {
      uVar7 = (ulong)uVar10;
    }
    for (uVar9 = 0; uVar7 != uVar9; uVar9 = uVar9 + 1) {
      ip[(long)(int)uVar10 + uVar9] = ip[uVar9] + n;
    }
    uVar10 = uVar10 * 2;
  }
  uVar5 = uVar10 * 2;
  if (uVar10 * 8 == n) {
    iVar1 = uVar10 * 4;
    uVar7 = 0;
    uVar9 = 0;
    if (0 < (int)uVar10) {
      uVar9 = (ulong)uVar10;
    }
    for (; uVar7 != uVar9; uVar7 = uVar7 + 1) {
      iVar11 = (int)uVar7 * 2;
      iVar12 = ip[uVar7];
      iVar19 = iVar12;
      for (uVar20 = 0; uVar7 != uVar20; uVar20 = uVar20 + 1) {
        lVar16 = (long)ip[uVar20] + (long)iVar11;
        dVar2 = a[iVar19];
        dVar3 = a[(long)iVar19 + 1];
        dVar4 = a[lVar16 + 1];
        a[iVar19] = a[lVar16];
        a[(long)iVar19 + 1] = -dVar4;
        a[lVar16] = dVar2;
        a[lVar16 + 1] = -dVar3;
        iVar15 = (int)lVar16 + iVar1;
        lVar16 = (long)(int)(uVar5 + iVar19);
        dVar2 = a[lVar16];
        dVar3 = a[lVar16 + 1];
        dVar4 = a[(long)iVar15 + 1];
        a[lVar16] = a[iVar15];
        a[lVar16 + 1] = -dVar4;
        a[iVar15] = dVar2;
        a[(long)iVar15 + 1] = -dVar3;
        iVar15 = iVar15 + uVar10 * -2;
        lVar16 = (long)(iVar1 + iVar19);
        dVar2 = a[lVar16];
        dVar3 = a[lVar16 + 1];
        dVar4 = a[(long)iVar15 + 1];
        a[lVar16] = a[iVar15];
        a[lVar16 + 1] = -dVar4;
        a[iVar15] = dVar2;
        a[(long)iVar15 + 1] = -dVar3;
        lVar17 = (long)(int)(uVar10 * 6 + iVar19);
        dVar2 = a[lVar17];
        dVar3 = a[lVar17 + 1];
        lVar16 = (long)(iVar15 + iVar1);
        dVar4 = a[lVar16 + 1];
        a[lVar17] = a[lVar16];
        a[lVar17 + 1] = -dVar4;
        a[lVar16] = dVar2;
        a[lVar16 + 1] = -dVar3;
        iVar19 = iVar19 + 2;
      }
      iVar12 = iVar12 + iVar11;
      a[(long)iVar12 + 1] = -a[(long)iVar12 + 1];
      iVar12 = iVar12 + uVar5;
      iVar11 = iVar12 + uVar5;
      dVar2 = a[iVar12];
      dVar3 = a[(long)iVar12 + 1];
      dVar4 = a[(long)iVar11 + 1];
      a[iVar12] = a[iVar11];
      a[(long)iVar12 + 1] = -dVar4;
      a[iVar11] = dVar2;
      a[(long)iVar11 + 1] = -dVar3;
      a[(long)(int)(iVar11 + uVar5) + 1] = -a[(long)(int)(iVar11 + uVar5) + 1];
    }
  }
  else {
    a[1] = -a[1];
    a[(int)(uVar5 | 1)] = -a[(int)(uVar5 | 1)];
    lVar17 = 4;
    for (lVar16 = 1; lVar16 < (int)uVar10; lVar16 = lVar16 + 1) {
      lVar13 = (long)ip[lVar16];
      iVar1 = (int)lVar16 * 2;
      lVar6 = lVar13 * 8 + (long)(int)uVar5 * 8 + 8;
      lVar14 = lVar13 * 8;
      for (lVar18 = 0; lVar17 != lVar18; lVar18 = lVar18 + 4) {
        lVar8 = (long)*(int *)((long)ip + lVar18) + (long)iVar1;
        dVar2 = *(double *)((long)a + lVar18 * 4 + lVar14);
        dVar3 = *(double *)((long)a + lVar18 * 4 + lVar14 + 8);
        dVar4 = a[lVar8 + 1];
        *(double *)((long)a + lVar18 * 4 + lVar14) = a[lVar8];
        *(double *)((long)a + lVar18 * 4 + lVar14 + 8) = -dVar4;
        a[lVar8] = dVar2;
        a[lVar8 + 1] = -dVar3;
        dVar2 = *(double *)((long)a + lVar18 * 4 + lVar6 + -8);
        dVar3 = *(double *)((long)a + lVar18 * 4 + lVar6);
        lVar8 = (long)(int)((int)lVar8 + uVar5);
        dVar4 = a[lVar8 + 1];
        *(double *)((long)a + lVar18 * 4 + lVar6 + -8) = a[lVar8];
        *(double *)((long)a + lVar18 * 4 + lVar6) = -dVar4;
        a[lVar8] = dVar2;
        a[lVar8 + 1] = -dVar3;
      }
      lVar13 = lVar13 + iVar1;
      a[lVar13 + 1] = -a[lVar13 + 1];
      lVar14 = (long)(int)((int)lVar13 + uVar5);
      a[lVar14 + 1] = -a[lVar14 + 1];
      lVar17 = lVar17 + 4;
    }
  }
  return;
}

Assistant:

void bitrv2conj(int n, int *ip, double *a)
{
    int j, j1, k, k1, l, m, m2;
    double xr, xi, yr, yi;
    
    ip[0] = 0;
    l = n;
    m = 1;
    while ((m << 3) < l) {
        l >>= 1;
        for (j = 0; j < m; j++) {
            ip[m + j] = ip[j] + l;
        }
        m <<= 1;
    }
    m2 = 2 * m;
    if ((m << 3) == l) {
        for (k = 0; k < m; k++) {
            for (j = 0; j < k; j++) {
                j1 = 2 * j + ip[k];
                k1 = 2 * k + ip[j];
                xr = a[j1];
                xi = -a[j1 + 1];
                yr = a[k1];
                yi = -a[k1 + 1];
                a[j1] = yr;
                a[j1 + 1] = yi;
                a[k1] = xr;
                a[k1 + 1] = xi;
                j1 += m2;
                k1 += 2 * m2;
                xr = a[j1];
                xi = -a[j1 + 1];
                yr = a[k1];
                yi = -a[k1 + 1];
                a[j1] = yr;
                a[j1 + 1] = yi;
                a[k1] = xr;
                a[k1 + 1] = xi;
                j1 += m2;
                k1 -= m2;
                xr = a[j1];
                xi = -a[j1 + 1];
                yr = a[k1];
                yi = -a[k1 + 1];
                a[j1] = yr;
                a[j1 + 1] = yi;
                a[k1] = xr;
                a[k1 + 1] = xi;
                j1 += m2;
                k1 += 2 * m2;
                xr = a[j1];
                xi = -a[j1 + 1];
                yr = a[k1];
                yi = -a[k1 + 1];
                a[j1] = yr;
                a[j1 + 1] = yi;
                a[k1] = xr;
                a[k1 + 1] = xi;
            }
            k1 = 2 * k + ip[k];
            a[k1 + 1] = -a[k1 + 1];
            j1 = k1 + m2;
            k1 = j1 + m2;
            xr = a[j1];
            xi = -a[j1 + 1];
            yr = a[k1];
            yi = -a[k1 + 1];
            a[j1] = yr;
            a[j1 + 1] = yi;
            a[k1] = xr;
            a[k1 + 1] = xi;
            k1 += m2;
            a[k1 + 1] = -a[k1 + 1];
        }
    } else {
        a[1] = -a[1];
        a[m2 + 1] = -a[m2 + 1];
        for (k = 1; k < m; k++) {
            for (j = 0; j < k; j++) {
                j1 = 2 * j + ip[k];
                k1 = 2 * k + ip[j];
                xr = a[j1];
                xi = -a[j1 + 1];
                yr = a[k1];
                yi = -a[k1 + 1];
                a[j1] = yr;
                a[j1 + 1] = yi;
                a[k1] = xr;
                a[k1 + 1] = xi;
                j1 += m2;
                k1 += m2;
                xr = a[j1];
                xi = -a[j1 + 1];
                yr = a[k1];
                yi = -a[k1 + 1];
                a[j1] = yr;
                a[j1 + 1] = yi;
                a[k1] = xr;
                a[k1 + 1] = xi;
            }
            k1 = 2 * k + ip[k];
            a[k1 + 1] = -a[k1 + 1];
            a[k1 + m2 + 1] = -a[k1 + m2 + 1];
        }
    }
}